

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

int phits_ensure_load(phits_fileinternal_t *f,int nbytes)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int actual;
  int missing;
  undefined4 local_4;
  
  if (in_ESI < 0x79) {
    iVar1 = in_ESI - *(int *)(in_RDI + 0x108);
    if (iVar1 < 1) {
      local_4 = 1;
    }
    else {
      iVar2 = mcpl_generic_fread_try(in_RDI,in_RDI + 0x90 + (ulong)*(uint *)(in_RDI + 0x108),iVar1);
      if (iVar2 == iVar1) {
        *(int *)(in_RDI + 0x108) = in_ESI;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int phits_ensure_load(phits_fileinternal_t* f, int nbytes)
{
  //For slowly filling up f->buf while reading first record. Returns 1 in case
  //of success.
  if ( nbytes > (int)PHITSREAD_MAXBUFSIZE )
    return 0;
  int missing = nbytes - f->lbuf;
  if ( missing<=0 )
    return 1;
  int actual = (int)mcpl_generic_fread_try( &f->filehandle,
                                            &(f->buf[f->lbuf]),
                                            (unsigned)missing );
  //int nr = phits_readbytes(f,&(f->buf[f->lbuf]),missing);
  if (actual!=missing)
    return 0;
  f->lbuf = nbytes;
  return 1;
}